

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

DdNode * cuddBddCharToVect(DdManager *dd,DdNode *f,DdNode *x)

{
  int *piVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *f_00;
  DdNode *pDVar4;
  DdNode *pDVar5;
  
  while( true ) {
    f_00 = f;
    pDVar3 = cuddCacheLookup2(dd,cuddBddCharToVect,f_00,x);
    if (pDVar3 != (DdNode *)0x0) {
      return pDVar3;
    }
    pDVar3 = (DdNode *)((ulong)f_00 & 0xfffffffffffffffe);
    uVar2 = 0x7fffffff;
    if ((ulong)pDVar3->index != 0x7fffffff) {
      uVar2 = dd->perm[pDVar3->index];
    }
    if ((uint)dd->perm[x->index] < uVar2) {
      return x;
    }
    pDVar5 = (DdNode *)((ulong)dd->one ^ 1);
    pDVar4 = (DdNode *)((ulong)(pDVar3->type).kids.T ^ (ulong)(pDVar3 != f_00));
    f = (DdNode *)((ulong)(pDVar3 != f_00) ^ (ulong)(pDVar3->type).kids.E);
    if (uVar2 == dd->perm[x->index]) break;
    if (pDVar4 != pDVar5) {
      pDVar4 = cuddBddCharToVect(dd,pDVar4,x);
      if (f != pDVar5) {
        if (pDVar4 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar5 = cuddBddCharToVect(dd,f,x);
          if (pDVar5 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar3 = cuddBddIteRecur(dd,dd->vars[pDVar3->index],pDVar4,pDVar5);
            if (pDVar3 != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              cuddCacheInsert2(dd,cuddBddCharToVect,f_00,x,pDVar3);
              return pDVar3;
            }
            Cudd_IterDerefBdd(dd,pDVar4);
            pDVar4 = pDVar5;
          }
          Cudd_IterDerefBdd(dd,pDVar4);
        }
        pDVar4 = (DdNode *)0x0;
      }
      return pDVar4;
    }
  }
  if (pDVar4 == pDVar5) {
    return pDVar5;
  }
  if (f != pDVar5) {
    return x;
  }
  return dd->one;
}

Assistant:

static DdNode *
cuddBddCharToVect(
  DdManager * dd,
  DdNode * f,
  DdNode * x)
{
    unsigned int topf;
    unsigned int level;
    int comple;

    DdNode *one, *zero, *res, *F, *fT, *fE, *T, *E;

    statLine(dd);
    /* Check the cache. */
    res = cuddCacheLookup2(dd, cuddBddCharToVect, f, x);
    if (res != NULL) {
        return(res);
    }

    F = Cudd_Regular(f);

    topf = cuddI(dd,F->index);
    level = dd->perm[x->index];

    if (topf > level) return(x);

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    comple = F != f;
    fT = Cudd_NotCond(cuddT(F),comple);
    fE = Cudd_NotCond(cuddE(F),comple);

    if (topf == level) {
        if (fT == zero) return(zero);
        if (fE == zero) return(one);
        return(x);
    }

    /* Here topf < level. */
    if (fT == zero) return(cuddBddCharToVect(dd, fE, x));
    if (fE == zero) return(cuddBddCharToVect(dd, fT, x));

    T = cuddBddCharToVect(dd, fT, x);
    if (T == NULL) {
        return(NULL);
    }
    cuddRef(T);
    E = cuddBddCharToVect(dd, fE, x);
    if (E == NULL) {
        Cudd_IterDerefBdd(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = cuddBddIteRecur(dd, dd->vars[F->index], T, E);
    if (res == NULL) {
        Cudd_IterDerefBdd(dd,T);
        Cudd_IterDerefBdd(dd,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);
    cuddCacheInsert2(dd, cuddBddCharToVect, f, x, res);
    return(res);

}